

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters_sse42_intr.c
# Opt level: O1

void ihevc_inter_pred_chroma_copy_sse42
               (UWORD8 *pu1_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  long lVar13;
  
  if ((wd & 1U) != 0) {
    __assert_fail("(wd % 2 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_inter_pred_filters_sse42_intr.c"
                  ,0xf7,
                  "void ihevc_inter_pred_chroma_copy_sse42(UWORD8 *, UWORD8 *, WORD32, WORD32, WORD8 *, WORD32, WORD32)"
                 );
  }
  if ((ht & 1U) != 0) {
    __assert_fail("(ht % 2 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_inter_pred_filters_sse42_intr.c"
                  ,0xf8,
                  "void ihevc_inter_pred_chroma_copy_sse42(UWORD8 *, UWORD8 *, WORD32, WORD32, WORD8 *, WORD32, WORD32)"
                 );
  }
  iVar1 = wd * 2;
  if ((ht & 2U) == 0) {
    if ((wd & 6U) == 0) {
      if (0 < ht) {
        iVar12 = 0;
        do {
          if (0 < wd) {
            lVar13 = 0;
            do {
              uVar5 = *(undefined8 *)(pu1_src + lVar13 + 8);
              uVar6 = *(undefined8 *)(pu1_src + lVar13 + src_strd);
              uVar7 = *(undefined8 *)(pu1_src + lVar13 + src_strd + 8);
              uVar8 = *(undefined8 *)(pu1_src + lVar13 + src_strd * 2);
              uVar9 = *(undefined8 *)(pu1_src + lVar13 + src_strd * 2 + 8);
              uVar10 = *(undefined8 *)(pu1_src + lVar13 + src_strd * 3);
              uVar11 = *(undefined8 *)(pu1_src + lVar13 + src_strd * 3 + 8);
              *(undefined8 *)(pu1_dst + lVar13) = *(undefined8 *)(pu1_src + lVar13);
              *(undefined8 *)(pu1_dst + lVar13 + 8) = uVar5;
              *(undefined8 *)(pu1_dst + lVar13 + dst_strd) = uVar6;
              *(undefined8 *)(pu1_dst + lVar13 + dst_strd + 8) = uVar7;
              *(undefined8 *)(pu1_dst + lVar13 + dst_strd * 2) = uVar8;
              *(undefined8 *)(pu1_dst + lVar13 + dst_strd * 2 + 8) = uVar9;
              *(undefined8 *)(pu1_dst + lVar13 + dst_strd * 3) = uVar10;
              *(undefined8 *)(pu1_dst + lVar13 + dst_strd * 3 + 8) = uVar11;
              lVar13 = lVar13 + 0x10;
            } while ((int)lVar13 < iVar1);
            pu1_src = pu1_src + lVar13;
            pu1_dst = pu1_dst + lVar13;
          }
          pu1_dst = pu1_dst + (dst_strd * 4 + wd * -2);
          pu1_src = pu1_src + (src_strd * 4 + wd * -2);
          iVar12 = iVar12 + 4;
        } while (iVar12 < ht);
      }
    }
    else if ((wd & 2U) == 0) {
      if (0 < ht) {
        iVar12 = 0;
        do {
          if (0 < wd) {
            lVar13 = 0;
            do {
              uVar5 = *(undefined8 *)(pu1_src + lVar13 + src_strd);
              uVar6 = *(undefined8 *)(pu1_src + lVar13 + src_strd * 2);
              uVar7 = *(undefined8 *)(pu1_src + lVar13 + src_strd * 3);
              *(undefined8 *)(pu1_dst + lVar13) = *(undefined8 *)(pu1_src + lVar13);
              *(undefined8 *)(pu1_dst + lVar13 + dst_strd) = uVar5;
              *(undefined8 *)(pu1_dst + lVar13 + dst_strd * 2) = uVar6;
              *(undefined8 *)(pu1_dst + lVar13 + dst_strd * 3) = uVar7;
              lVar13 = lVar13 + 8;
            } while ((int)lVar13 < iVar1);
            pu1_src = pu1_src + lVar13;
            pu1_dst = pu1_dst + lVar13;
          }
          pu1_dst = pu1_dst + (dst_strd * 4 + wd * -2);
          pu1_src = pu1_src + (src_strd * 4 + wd * -2);
          iVar12 = iVar12 + 4;
        } while (iVar12 < ht);
      }
    }
    else if (0 < ht) {
      iVar12 = 0;
      do {
        if (0 < wd) {
          lVar13 = 0;
          do {
            uVar2 = *(undefined4 *)(pu1_src + lVar13 + src_strd);
            uVar3 = *(undefined4 *)(pu1_src + lVar13 + src_strd * 2);
            uVar4 = *(undefined4 *)(pu1_src + lVar13 + src_strd * 3);
            *(undefined4 *)(pu1_dst + lVar13) = *(undefined4 *)(pu1_src + lVar13);
            *(undefined4 *)(pu1_dst + lVar13 + dst_strd) = uVar2;
            *(undefined4 *)(pu1_dst + lVar13 + dst_strd * 2) = uVar3;
            *(undefined4 *)(pu1_dst + lVar13 + dst_strd * 3) = uVar4;
            lVar13 = lVar13 + 4;
          } while ((int)lVar13 < iVar1);
          pu1_src = pu1_src + lVar13;
          pu1_dst = pu1_dst + lVar13;
        }
        pu1_dst = pu1_dst + (dst_strd * 4 + wd * -2);
        pu1_src = pu1_src + (src_strd * 4 + wd * -2);
        iVar12 = iVar12 + 4;
      } while (iVar12 < ht);
    }
  }
  else if ((wd & 6U) == 0) {
    if (0 < ht) {
      iVar12 = 0;
      do {
        if (0 < wd) {
          lVar13 = 0;
          do {
            uVar5 = *(undefined8 *)(pu1_src + lVar13 + 8);
            uVar6 = *(undefined8 *)(pu1_src + lVar13 + src_strd);
            uVar7 = *(undefined8 *)(pu1_src + lVar13 + src_strd + 8);
            *(undefined8 *)(pu1_dst + lVar13) = *(undefined8 *)(pu1_src + lVar13);
            *(undefined8 *)(pu1_dst + lVar13 + 8) = uVar5;
            *(undefined8 *)(pu1_dst + lVar13 + dst_strd) = uVar6;
            *(undefined8 *)(pu1_dst + lVar13 + dst_strd + 8) = uVar7;
            lVar13 = lVar13 + 0x10;
          } while ((int)lVar13 < iVar1);
          pu1_src = pu1_src + lVar13;
          pu1_dst = pu1_dst + lVar13;
        }
        pu1_dst = pu1_dst + (dst_strd - wd) * 2;
        pu1_src = pu1_src + (src_strd - wd) * 2;
        iVar12 = iVar12 + 2;
      } while (iVar12 < ht);
    }
  }
  else if ((wd & 2U) == 0) {
    if (0 < ht) {
      iVar12 = 0;
      do {
        if (0 < wd) {
          lVar13 = 0;
          do {
            uVar5 = *(undefined8 *)(pu1_src + lVar13 + src_strd);
            *(undefined8 *)(pu1_dst + lVar13) = *(undefined8 *)(pu1_src + lVar13);
            *(undefined8 *)(pu1_dst + lVar13 + dst_strd) = uVar5;
            lVar13 = lVar13 + 8;
          } while ((int)lVar13 < iVar1);
          pu1_src = pu1_src + lVar13;
          pu1_dst = pu1_dst + lVar13;
        }
        pu1_dst = pu1_dst + (dst_strd - wd) * 2;
        pu1_src = pu1_src + (src_strd - wd) * 2;
        iVar12 = iVar12 + 2;
      } while (iVar12 < ht);
    }
  }
  else if (0 < ht) {
    iVar12 = 0;
    do {
      if (0 < wd) {
        lVar13 = 0;
        do {
          uVar2 = *(undefined4 *)(pu1_src + lVar13 + src_strd);
          *(undefined4 *)(pu1_dst + lVar13) = *(undefined4 *)(pu1_src + lVar13);
          *(undefined4 *)(pu1_dst + lVar13 + dst_strd) = uVar2;
          lVar13 = lVar13 + 4;
        } while ((int)lVar13 < iVar1);
        pu1_src = pu1_src + lVar13;
        pu1_dst = pu1_dst + lVar13;
      }
      pu1_dst = pu1_dst + (dst_strd - wd) * 2;
      pu1_src = pu1_src + (src_strd - wd) * 2;
      iVar12 = iVar12 + 2;
    } while (iVar12 < ht);
  }
  return;
}

Assistant:

void ihevc_inter_pred_chroma_copy_sse42(UWORD8 *pu1_src,
                                        UWORD8 *pu1_dst,
                                        WORD32 src_strd,
                                        WORD32 dst_strd,
                                        WORD8 *pi1_coeff,
                                        WORD32 ht,
                                        WORD32 wd)
{
    WORD32 row, col, wdx2;
    __m128i  src0_16x8b, src1_16x8b, src2_16x8b, src3_16x8b;

    ASSERT(wd % 2 == 0); /* checking assumption*/
    ASSERT(ht % 2 == 0); /* checking assumption*/
    UNUSED(pi1_coeff);
    wdx2 = wd * 2;

    if(0 == (ht & 3)) /* ht multiple of 4 */
    {
        if(0 == (wdx2 & 15)) /* wdx2 multiple of 16 case */
        {
            for(row = 0; row < ht; row += 4)
            {
                for(col = 0; col < wdx2; col += 16)
                {
                    /*load 16 pixel values from 15:0 pos. relative to cur. pos.*/
                    src0_16x8b = _mm_loadu_si128((__m128i *)(pu1_src));                /* row =0 */
                    src1_16x8b = _mm_loadu_si128((__m128i *)(pu1_src + 1 * src_strd)); /* row =1 */
                    src2_16x8b = _mm_loadu_si128((__m128i *)(pu1_src + 2 * src_strd)); /* row =2 */
                    src3_16x8b = _mm_loadu_si128((__m128i *)(pu1_src + 3 * src_strd)); /* row =3 */

                    /* storing 16 8-bit output values */
                    _mm_storeu_si128((__m128i *)(pu1_dst), src0_16x8b);                 /* row =0 */
                    _mm_storeu_si128((__m128i *)(pu1_dst + 1 * dst_strd), src1_16x8b);  /* row =1 */
                    _mm_storeu_si128((__m128i *)(pu1_dst + 2 * dst_strd), src2_16x8b);  /* row =2 */
                    _mm_storeu_si128((__m128i *)(pu1_dst + 3 * dst_strd), src3_16x8b);  /* row =3 */

                    pu1_src += 16; /* pointer update */
                    pu1_dst += 16; /* pointer update */
                } /* inner for loop ends here(16-output values in single iteration) */

                pu1_src += 4 * src_strd - wdx2; /* pointer update */
                pu1_dst += 4 * dst_strd - wdx2; /* pointer update */
            }

        }
        else if(0 == (wdx2 & 7)) /* multiple of 8 case */
        {
            for(row = 0; row < ht; row += 4)
            {
                for(col = 0; col < wdx2; col += 8)
                {
                    /*load 16 pixel values from 15:0 pos. relative to cur. pos.*/
                    src0_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src));                /* row =0 */
                    src1_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 1 * src_strd)); /* row =1 */
                    src2_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 2 * src_strd)); /* row =2 */
                    src3_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 3 * src_strd)); /* row =3 */

                    /* storing 16 8-bit output values */
                    _mm_storel_epi64((__m128i *)(pu1_dst), src0_16x8b);                 /* row =0 */
                    _mm_storel_epi64((__m128i *)(pu1_dst + 1 * dst_strd), src1_16x8b);  /* row =1 */
                    _mm_storel_epi64((__m128i *)(pu1_dst + 2 * dst_strd), src2_16x8b);  /* row =2 */
                    _mm_storel_epi64((__m128i *)(pu1_dst + 3 * dst_strd), src3_16x8b);  /* row =3 */

                    pu1_src += 8; /* pointer update */
                    pu1_dst += 8; /* pointer update */
                } /*  inner for loop ends here(8-output values in single iteration) */

                pu1_src += 4 * src_strd - wdx2; /* pointer update */
                pu1_dst += 4 * dst_strd - wdx2; /* pointer update */
            }
        }
        else /* wdx2 = multiple of 4 case */
        {
            WORD32 dst0, dst1, dst2, dst3;
            for(row = 0; row < ht; row += 4)
            {
                for(col = 0; col < wdx2; col += 4)
                {
                    /*load 16 pixel values from 15:0 pos. relative to cur. pos.*/
                    src0_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src));                /* row =0 */
                    src1_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 1 * src_strd)); /* row =1 */
                    src2_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 2 * src_strd)); /* row =2 */
                    src3_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 3 * src_strd)); /* row =3 */

                    dst0 = _mm_cvtsi128_si32(src0_16x8b);
                    dst1 = _mm_cvtsi128_si32(src1_16x8b);
                    dst2 = _mm_cvtsi128_si32(src2_16x8b);
                    dst3 = _mm_cvtsi128_si32(src3_16x8b);

                    /* storing 4 8-bit output values */
                    *(WORD32 *)(&pu1_dst[0 * dst_strd]) = dst0; /* row =0 */
                    *(WORD32 *)(&pu1_dst[1 * dst_strd]) = dst1; /* row =1 */
                    *(WORD32 *)(&pu1_dst[2 * dst_strd]) = dst2; /* row =2 */
                    *(WORD32 *)(&pu1_dst[3 * dst_strd]) = dst3; /* row =3 */

                    pu1_src += 4; /* pointer update */
                    pu1_dst += 4; /* pointer update */
                } /*  inner for loop ends here(4- output values in single iteration) */

                pu1_src += 4 * src_strd - wdx2; /* pointer update */
                pu1_dst += 4 * dst_strd - wdx2; /* pointer update */
            }
        }
    }
    else /* ht multiple of 2 */
    {
        if(0 == (wdx2 & 15)) /* wdx2 multiple of 16 case */
        {
            for(row = 0; row < ht; row += 2)
            {
                for(col = 0; col < wdx2; col += 16)
                {
                    /*load 16 pixel values from 15:0 pos. relative to cur. pos.*/
                    src0_16x8b = _mm_loadu_si128((__m128i *)(pu1_src));                /* row =0 */
                    src1_16x8b = _mm_loadu_si128((__m128i *)(pu1_src + 1 * src_strd)); /* row =1 */

                    /* storing 16 8-bit output values */
                    _mm_storeu_si128((__m128i *)(pu1_dst), src0_16x8b);                 /* row =0 */
                    _mm_storeu_si128((__m128i *)(pu1_dst + 1 * dst_strd), src1_16x8b);  /* row =1 */

                    pu1_src += 16; /* pointer update */
                    pu1_dst += 16; /* pointer update */
                } /* inner for loop ends here(16-output values in single iteration) */

                pu1_src += 2 * src_strd - wdx2; /* pointer update */
                pu1_dst += 2 * dst_strd - wdx2; /* pointer update */
            }

        }
        else if(0 == (wdx2 & 7)) /* multiple of 8 case */
        {
            for(row = 0; row < ht; row += 2)
            {
                for(col = 0; col < wdx2; col += 8)
                {
                    /*load 16 pixel values from 15:0 pos. relative to cur. pos.*/
                    src0_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src));                /* row =0 */
                    src1_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 1 * src_strd)); /* row =1 */

                    /* storing 16 8-bit output values */
                    _mm_storel_epi64((__m128i *)(pu1_dst), src0_16x8b);                 /* row =0 */
                    _mm_storel_epi64((__m128i *)(pu1_dst + 1 * dst_strd), src1_16x8b);  /* row =1 */

                    pu1_src += 8; /* pointer update */
                    pu1_dst += 8; /* pointer update */
                } /*  inner for loop ends here(8-output values in single iteration) */

                pu1_src += 2 * src_strd - wdx2; /* pointer update */
                pu1_dst += 2 * dst_strd - wdx2; /* pointer update */
            }
        }
        else /* wdx2 = multiple of 4 case */
        {
            WORD32 dst0, dst1;
            for(row = 0; row < ht; row += 2)
            {
                for(col = 0; col < wdx2; col += 4)
                {
                    /*load 16 pixel values from 15:0 pos. relative to cur. pos.*/
                    src0_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src));                /* row =0 */
                    src1_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 1 * src_strd)); /* row =1 */

                    dst0 = _mm_cvtsi128_si32(src0_16x8b);
                    dst1 = _mm_cvtsi128_si32(src1_16x8b);


                    /* storing 4 8-bit output values */
                    *(WORD32 *)(&pu1_dst[0 * dst_strd]) = dst0; /* row =0 */
                    *(WORD32 *)(&pu1_dst[1 * dst_strd]) = dst1; /* row =1 */

                    pu1_src += 4; /* pointer update */
                    pu1_dst += 4; /* pointer update */
                } /*  inner for loop ends here(4- output values in single iteration) */

                pu1_src += 2 * src_strd - wdx2; /* pointer update */
                pu1_dst += 2 * dst_strd - wdx2; /* pointer update */
            }
        }
    }
}